

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O2

void __thiscall hmac_hash::SHA256::transform(SHA256 *this,uint8_t *message,size_t block_nb)

{
  long lVar1;
  size_t sVar2;
  uint uVar3;
  uint8_t *puVar4;
  uint uVar5;
  int iVar6;
  uint local_178 [9];
  int aiStack_154 [5];
  uint local_140 [68];
  
  puVar4 = message + 3;
  for (sVar2 = 0; sVar2 != block_nb; sVar2 = sVar2 + 1) {
    for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
      uVar3 = *(uint *)(puVar4 + lVar1 * 4 + -3);
      local_140[lVar1 + 2] =
           uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    }
    for (lVar1 = 0x10; lVar1 != 0x40; lVar1 = lVar1 + 1) {
      uVar3 = local_140[lVar1];
      uVar5 = local_178[lVar1 + 1];
      local_140[lVar1 + 2] =
           (uVar3 >> 10 ^ (uVar3 << 0xd | uVar3 >> 0x13) ^ (uVar3 << 0xf | uVar3 >> 0x11)) +
           aiStack_154[lVar1] + local_178[lVar1] +
           (uVar5 >> 3 ^ (uVar5 << 0xe | uVar5 >> 0x12) ^ (uVar5 << 0x19 | uVar5 >> 7));
    }
    for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
      local_178[lVar1] = this->m_h[lVar1];
    }
    for (lVar1 = 0; uVar3 = local_178[2], local_178[2] = local_178[1], local_178[1] = local_178[0],
        uVar5 = local_178[5], local_178[5] = local_178[4], lVar1 != 0x100; lVar1 = lVar1 + 4) {
      iVar6 = ((local_178[5] << 7 | local_178[5] >> 0x19) ^
              (local_178[5] << 0x15 | local_178[5] >> 0xb) ^
              (local_178[5] << 0x1a | local_178[5] >> 6)) + local_178[7] +
              *(int *)((long)&sha256_k + lVar1) +
              ((uVar5 ^ local_178[6]) & local_178[5] ^ local_178[6]) +
              *(int *)((long)local_140 + lVar1 + 8);
      local_178[7] = local_178[6];
      local_178[4] = local_178[3] + iVar6;
      local_178[6] = uVar5;
      local_178[0] = (uVar3 & local_178[2] ^ (uVar3 ^ local_178[2]) & local_178[1]) +
                     ((local_178[1] << 10 | local_178[1] >> 0x16) ^
                     (local_178[1] << 0x13 | local_178[1] >> 0xd) ^
                     (local_178[1] << 0x1e | local_178[1] >> 2)) + iVar6;
      local_178[3] = uVar3;
    }
    local_178[4] = local_178[5];
    local_178[5] = uVar5;
    local_178[0] = local_178[1];
    local_178[1] = local_178[2];
    local_178[2] = uVar3;
    for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
      this->m_h[lVar1] = this->m_h[lVar1] + local_178[lVar1];
    }
    puVar4 = puVar4 + 0x40;
  }
  return;
}

Assistant:

void SHA256::transform(const uint8_t *message, size_t block_nb) {
        uint32_t w[64];
        uint32_t wv[8];
        uint32_t t1, t2;
        const uint8_t *sub_block;
        size_t i;
        size_t j;
        for(i = 0; i < block_nb; ++i) {
            sub_block = message + (i << 6);
            for(j = 0; j < 16; ++j) {
                SHA2_PACK32(&sub_block[j << 2], &w[j]);
            }
            for(j = 16; j < 64; ++j) {
                w[j] =  SHA256_F4(w[j -  2]) + w[j -  7] + SHA256_F3(w[j - 15]) + w[j - 16];
            }
            for(j = 0; j < 8; ++j) {
                wv[j] = m_h[j];
            }
            for(j = 0; j < 64; ++j) {
                t1 = wv[7] + SHA256_F2(wv[4]) + SHA2_CH(wv[4], wv[5], wv[6])
                    + sha256_k[j] + w[j];
                t2 = SHA256_F1(wv[0]) + SHA2_MAJ(wv[0], wv[1], wv[2]);
                wv[7] = wv[6];
                wv[6] = wv[5];
                wv[5] = wv[4];
                wv[4] = wv[3] + t1;
                wv[3] = wv[2];
                wv[2] = wv[1];
                wv[1] = wv[0];
                wv[0] = t1 + t2;
            }
            for(j = 0; j < 8; ++j) {
                m_h[j] += wv[j];
            }
        }
    }